

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::ReturnInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ReturnInst>,LLVMBC::ReturnInst*&>
          (LLVMContext *this,ReturnInst **u)

{
  ReturnInst *pRVar1;
  TypedDeleter<LLVMBC::ReturnInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::ReturnInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::ReturnInst> *)0x0) {
    pRVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f3500;
    pTVar2->ptr = pRVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}